

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

text * __thiscall lest::env::sections_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  long lVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  text *local_38;
  
  if ((this->opt).verbose == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  pbVar2 = (this->ctx).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = __return_storage_ptr__;
  if ((this->ctx).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish == pbVar2) {
    paVar1 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  }
  else {
    lVar3 = 0;
    lVar4 = 0;
    do {
      std::operator+(&local_78,"\n  ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar2->_M_dataplus)._M_p + lVar3));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_58,local_78._M_dataplus._M_p,local_78._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      lVar4 = lVar4 + 1;
      pbVar2 = (this->ctx).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x20;
    } while (lVar4 != (long)(this->ctx).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
    paVar1 = &local_38->field_2;
    (local_38->_M_dataplus)._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      (local_38->_M_dataplus)._M_p = local_58._M_dataplus._M_p;
      (local_38->field_2)._M_allocated_capacity =
           CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
      goto LAB_0010ca22;
    }
  }
  paVar1->_M_allocated_capacity =
       CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,local_58.field_2._M_local_buf[0]);
  *(undefined8 *)((long)paVar1 + 8) = local_58.field_2._8_8_;
LAB_0010ca22:
  local_38->_M_string_length = local_58._M_string_length;
  return local_38;
}

Assistant:

text sections()
    {
        if ( ! opt.verbose )
            return "";

        text msg;
        for( size_t i = 0; i != ctx.size(); ++i )
        {
            msg += "\n  " + ctx[i];
        }
        return msg;
    }